

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.cpp
# Opt level: O1

void push(int argc,char **argv)

{
  pointer pbVar1;
  pointer pcVar2;
  undefined1 *__s1;
  int iVar3;
  int iVar4;
  size_t sVar5;
  undefined8 *puVar6;
  long *plVar7;
  long lVar8;
  ulong uVar9;
  pointer pbVar10;
  size_type *psVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  client_hashes;
  string dir;
  string server_hash;
  Msg msg;
  undefined1 local_968 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_948;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_938;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_928;
  pointer *local_910;
  long local_908;
  pointer local_900 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  undefined1 *local_8d0;
  size_t local_8c8;
  undefined1 local_8c0 [16];
  ulong local_8b0;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  Msg local_804;
  
  if (argc < 2) {
    printf("need 2 arguments");
  }
  iVar3 = atoi(*argv);
  iVar3 = client_start(iVar3,argv[1]);
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_828,HEAD_abi_cxx11_._M_dataplus._M_p,
             HEAD_abi_cxx11_._M_dataplus._M_p + HEAD_abi_cxx11_._M_string_length);
  fileToMsg(&local_828,&local_804);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p);
  }
  local_804.type = MSG_PUSH;
  send(iVar3,&local_804,0x7d4,0);
  recv(iVar3,&local_804,0x7d4,0x100);
  if (local_804.type == MSG_END) {
    puts("Repositories not compatible");
    goto LAB_0010b52a;
  }
  local_8d0 = local_8c0;
  sVar5 = strlen(local_804.buf2);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8d0,local_804.buf2,local_804.buf2 + sVar5);
  read_all_lines_abi_cxx11_(&local_928,HEAD_abi_cxx11_._M_dataplus._M_p);
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_848,HEAD_abi_cxx11_._M_dataplus._M_p,
             HEAD_abi_cxx11_._M_dataplus._M_p + HEAD_abi_cxx11_._M_string_length);
  fileToMsg(&local_848,&local_804);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p);
  }
  local_804.type = MSG_PULL;
  send(iVar3,&local_804,0x7d4,0);
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_868,LOG_abi_cxx11_._M_dataplus._M_p,
             LOG_abi_cxx11_._M_dataplus._M_p + LOG_abi_cxx11_._M_string_length);
  fileToMsg(&local_868,&local_804);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p);
  }
  send(iVar3,&local_804,0x7d4,0);
  iVar4 = std::__cxx11::string::compare((char *)&local_8d0);
  __s1 = local_8d0;
  if (iVar4 != 0) {
    psVar11 = &(local_928.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    lVar8 = 0x100000000;
    do {
      if (local_8c8 == *psVar11) {
        if (local_8c8 == 0) goto LAB_0010b1eb;
        iVar4 = bcmp(__s1,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (psVar11 + -1))->_M_dataplus)._M_p,local_8c8);
        if (iVar4 == 0) goto LAB_0010b1eb;
      }
      lVar8 = lVar8 + 0x100000000;
      psVar11 = psVar11 + 4;
    } while( true );
  }
  uVar9 = 0;
LAB_0010b1f3:
  if (uVar9 < (ulong)((long)local_928.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_928.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    do {
      local_968._0_8_ = local_968 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_968,COMMITS_DIR_abi_cxx11_._M_dataplus._M_p,
                 COMMITS_DIR_abi_cxx11_._M_dataplus._M_p + COMMITS_DIR_abi_cxx11_._M_string_length);
      std::__cxx11::string::append(local_968);
      local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
      pcVar2 = local_928.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8a8,pcVar2,
                 pcVar2 + local_928.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_string_length);
      deleteEndl(&local_8a8);
      pbVar10 = (pointer)0xf;
      if ((pointer)local_968._0_8_ != (pointer)(local_968 + 0x10)) {
        pbVar10 = (pointer)local_968._16_8_;
      }
      pbVar1 = (pointer)((long)&((_Alloc_hider *)local_968._8_8_)->_M_p + local_908);
      if (pbVar10 < pbVar1) {
        pbVar10 = (pointer)0xf;
        if (local_910 != local_900) {
          pbVar10 = local_900[0];
        }
        if (pbVar10 < pbVar1) goto LAB_0010b2e1;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_910,0,(char *)0x0,local_968._0_8_);
      }
      else {
LAB_0010b2e1:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_968,(ulong)local_910);
      }
      local_948._M_allocated_capacity = (size_type)&local_938;
      psVar11 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_938._M_allocated_capacity = *psVar11;
        local_938._8_8_ = puVar6[3];
      }
      else {
        local_938._M_allocated_capacity = *psVar11;
        local_948._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar6;
      }
      local_948._8_8_ = puVar6[1];
      *puVar6 = psVar11;
      puVar6[1] = 0;
      *(undefined1 *)psVar11 = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_948._M_local_buf);
      local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
      psVar11 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_8f0.field_2._M_allocated_capacity = *psVar11;
        local_8f0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_8f0.field_2._M_allocated_capacity = *psVar11;
        local_8f0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_8f0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_allocated_capacity != &local_938) {
        operator_delete((void *)local_948._M_allocated_capacity);
      }
      if (local_910 != local_900) {
        operator_delete(local_910);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
        operator_delete(local_8a8._M_dataplus._M_p);
      }
      local_8b0 = uVar9;
      if ((pointer)local_968._0_8_ != (pointer)(local_968 + 0x10)) {
        operator_delete((void *)local_968._0_8_);
      }
      ls_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_968,local_8f0._M_dataplus._M_p);
      if (local_968._8_8_ != local_968._0_8_) {
        lVar8 = 0;
        uVar9 = 0;
        do {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_948,&local_8f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((_Alloc_hider *)local_968._0_8_)->_M_p + lVar8));
          local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_888,local_948._M_allocated_capacity,
                     (char *)(local_948._M_allocated_capacity + local_948._8_8_));
          fileToMsg(&local_888,&local_804);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_888._M_dataplus._M_p != &local_888.field_2) {
            operator_delete(local_888._M_dataplus._M_p);
          }
          local_804.type = MSG_PULL;
          send(iVar3,&local_804,0x7d4,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_948._M_allocated_capacity != &local_938) {
            operator_delete((void *)local_948._M_allocated_capacity);
          }
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar9 < (ulong)((long)(local_968._8_8_ - local_968._0_8_) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_968);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
        operator_delete(local_8f0._M_dataplus._M_p);
      }
      uVar9 = local_8b0 + 1;
    } while (uVar9 < (ulong)((long)local_928.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_928.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_928);
  if (local_8d0 != local_8c0) {
    operator_delete(local_8d0);
  }
LAB_0010b52a:
  client_stop();
  return;
LAB_0010b1eb:
  uVar9 = lVar8 >> 0x20;
  goto LAB_0010b1f3;
}

Assistant:

void push(int argc, char *argv[]){
    if(argc < 2){
        printf("need 2 arguments");
    }
    int port = atoi(argv[0]);
    char *address = argv[1];
    int sock = client_start(port,address);

    Msg msg;
    fileToMsg(HEAD,msg);
    msg.type = MSG_PUSH;
    send(sock,&msg,sizeof(msg),0);
    recv(sock, &msg, sizeof(msg), MSG_WAITALL);
    if(msg.type != MSG_END){
        String server_hash = msg.buf2;
        Vector<String> client_hashes = read_all_lines(HEAD.c_str());
        fileToMsg(HEAD,msg);
        msg.type = MSG_PULL;
        send(sock,&msg,sizeof(msg),0);
        fileToMsg(LOG,msg);
        send(sock,&msg,sizeof(msg),0);
        int i = 0;
        if(server_hash != ""){
            while(server_hash != client_hashes[i]){
                i++;
            }
            i++;
        }
        while(i<client_hashes.size()){
            String dir = COMMITS_DIR + "/" + deleteEndl(client_hashes[i]) + "/";
            Vector<String> files = ls(dir.c_str());
            for(int j = 0; j < files.size();j++){
                String file = dir + files[j];
                fileToMsg(file,msg);
                msg.type = MSG_PULL;
                send(sock,&msg,sizeof(msg),0);
            }
            i++;
        }
    }
    else{
        printf("Repositories not compatible\n");
    }
    client_stop();
}